

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O0

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_local_slabs<true>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          smallsizeclass_t sizeclass)

{
  Node *this_00;
  long in_RSI;
  long in_RDI;
  DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider> *in_stack_00000010;
  anon_class_16_2_833c3684 *in_stack_00000018;
  Node *next;
  Node *curr;
  undefined1 local_40 [32];
  Node *local_20;
  Node *local_18;
  undefined1 *local_10;
  Node *local_8;
  
  this_00 = (Node *)(in_RDI + 0x1c30 + in_RSI * 0x18);
  local_10 = local_40;
  local_18 = ((Node *)&this_00->next)->next;
  local_8 = this_00;
  SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::Node::invariant
            (local_18);
  while (local_18 != this_00) {
    local_20 = local_18->next;
    SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::containing
              ((SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *)this_00
               ,local_18);
    Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
    dealloc_local_slabs<true>(unsigned_long)::{lambda(auto:1*)#1}::operator()
              (in_stack_00000018,in_stack_00000010);
    local_18 = local_20;
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void dealloc_local_slabs(smallsizeclass_t sizeclass)
    {
      // Return unused slabs of sizeclass_t back to global allocator
      alloc_classes[sizeclass].available.iterate([this, sizeclass](auto* meta) {
        auto domesticate =
          [this](freelist::QueuePtr p) SNMALLOC_FAST_PATH_LAMBDA {
            auto res = capptr_domesticate<Config>(backend_state_ptr(), p);
#ifdef SNMALLOC_TRACING
            if (res.unsafe_ptr() != p.unsafe_ptr())
              printf(
                "Domesticated %p to %p!\n", p.unsafe_ptr(), res.unsafe_ptr());
#endif
            return res;
          };

        if (meta->needed() != 0)
        {
          if (check_slabs)
          {
            meta->free_queue.validate(
              freelist::Object::key_root, meta->as_key_tweak(), domesticate);
          }
          return;
        }

        alloc_classes[sizeclass].length--;
        alloc_classes[sizeclass].unused--;

        // Remove from the list.  This must be done before dealloc chunk
        // as that may corrupt the node.
        meta->node.remove();

        // TODO delay the clear to the next user of the slab, or teardown so
        // don't touch the cache lines at this point in snmalloc_check_client.
        auto start = clear_slab(meta, sizeclass);

        Config::Backend::dealloc_chunk(
          get_backend_local_state(),
          *meta,
          start,
          sizeclass_to_slab_size(sizeclass),
          sizeclass_t::from_small_class(sizeclass));
      });
    }